

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadCustomMultiple::LoadIntLoadResidual_Mv
          (ChLoadCustomMultiple *this,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  double dVar1;
  Scalar SVar2;
  undefined1 auVar3 [16];
  element_type *peVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  CoeffReturnType pdVar8;
  Scalar *pSVar9;
  pointer psVar10;
  ulong uVar11;
  int i_1;
  ulong uVar12;
  int i;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChVectorDynamic<> grouped_cMv;
  ChVectorDynamic<> grouped_w;
  double local_c8;
  Matrix<double,__1,_1,_0,__1,_1> local_c0;
  Matrix<double,__1,_1,_0,__1,_1> local_b0;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *local_a0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_60;
  
  if ((this->super_ChLoadBase).jacobians != (ChLoadJacobians *)0x0) {
    local_c8 = c;
    local_a0 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R;
    local_98.m_lhs._0_4_ = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[7])();
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_b0,(int *)&local_98);
    local_98.m_lhs._0_4_ = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[7])(this);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_c0,(int *)&local_98);
    uVar12 = 0;
    for (uVar11 = 0;
        psVar10 = (this->loadables).
                  super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar11 < (ulong)((long)(this->loadables).
                               super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)psVar10 >> 4);
        uVar11 = uVar11 + 1) {
      uVar14 = 0;
      while( true ) {
        iVar5 = (*(psVar10[uVar11].
                   super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_ChLoadable[8])();
        if (iVar5 <= (int)uVar14) break;
        peVar4 = (this->loadables).
                 super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11].
                 super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar5 = (*peVar4->_vptr_ChLoadable[0xb])(peVar4,uVar14);
        if ((char)iVar5 != '\0') {
          peVar4 = (this->loadables).
                   super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].
                   super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar5 = (*peVar4->_vptr_ChLoadable[9])(peVar4,uVar14);
          uVar13 = 0;
          while( true ) {
            peVar4 = (this->loadables).
                     super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11].
                     super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            uVar6 = (*peVar4->_vptr_ChLoadable[10])(peVar4,uVar14);
            if (uVar6 <= uVar13) break;
            pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                                (ulong)(uint)(iVar5 + (int)uVar13));
            dVar1 = *pdVar8;
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &local_b0,uVar12 + uVar13 & 0xffffffff);
            uVar13 = uVar13 + 1;
            *pSVar9 = dVar1;
          }
          uVar12 = (ulong)(uint)((int)uVar12 + (int)uVar13);
        }
        psVar10 = (this->loadables).
                  super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = (ulong)((int)uVar14 + 1);
      }
    }
    Eigen::operator*(&local_60,&local_c8,(StorageBaseType *)&((this->super_ChLoadBase).jacobians)->M
                    );
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
    ::Product(&local_98,&local_60,&local_b0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              (&local_c0,&local_98);
    uVar6 = 0;
    for (uVar11 = 0;
        psVar10 = (this->loadables).
                  super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar11 < (ulong)((long)(this->loadables).
                               super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)psVar10 >> 4);
        uVar11 = uVar11 + 1) {
      uVar12 = 0;
      while( true ) {
        iVar5 = (*(psVar10[uVar11].
                   super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_ChLoadable[8])();
        if (iVar5 <= (int)uVar12) break;
        peVar4 = (this->loadables).
                 super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11].
                 super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar5 = (*peVar4->_vptr_ChLoadable[0xb])(peVar4,uVar12);
        if ((char)iVar5 != '\0') {
          peVar4 = (this->loadables).
                   super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].
                   super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar5 = (*peVar4->_vptr_ChLoadable[9])(peVar4,uVar12);
          uVar14 = 0;
          while( true ) {
            peVar4 = (this->loadables).
                     super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11].
                     super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            uVar7 = (*peVar4->_vptr_ChLoadable[10])(peVar4,uVar12);
            if (uVar7 <= uVar14) break;
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &local_c0,uVar6 + uVar14 & 0xffffffff);
            dVar1 = local_c8;
            SVar2 = *pSVar9;
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                               (local_a0,(ulong)(uint)(iVar5 + (int)uVar14));
            auVar15._8_8_ = 0;
            auVar15._0_8_ = SVar2;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = dVar1;
            uVar14 = uVar14 + 1;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *pSVar9;
            auVar3 = vfmadd213sd_fma(auVar16,auVar15,auVar3);
            *pSVar9 = auVar3._0_8_;
          }
          uVar6 = uVar6 + (int)uVar14;
        }
        psVar10 = (this->loadables).
                  super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = (ulong)((int)uVar12 + 1);
      }
    }
    Eigen::internal::handmade_aligned_free
              (local_c0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
  }
  return;
}

Assistant:

void ChLoadCustomMultiple::LoadIntLoadResidual_Mv(ChVectorDynamic<>& R, const ChVectorDynamic<>& w, const double c) {
    if (!this->jacobians)
        return;
    // fetch w as a contiguous vector
    ChVectorDynamic<> grouped_w(this->LoadGet_ndof_w());
    ChVectorDynamic<> grouped_cMv(this->LoadGet_ndof_w());
    unsigned int rowQ = 0;
    for (int k = 0; k < loadables.size(); ++k) {
        for (int i = 0; i < loadables[k]->GetSubBlocks(); ++i) {
            if (loadables[k]->IsSubBlockActive(i)) {
                unsigned int moffset = loadables[k]->GetSubBlockOffset(i);
                for (unsigned int row = 0; row < loadables[k]->GetSubBlockSize(i); ++row) {
                    grouped_w(rowQ) = w(row + moffset);
                    ++rowQ;
                }
            }
        }
    }
    // do computation R=c*M*v
    grouped_cMv = c * this->jacobians->M * grouped_w;
    rowQ = 0;
    for (int k = 0; k < loadables.size(); ++k) {
        for (int i = 0; i < loadables[k]->GetSubBlocks(); ++i) {
            if (loadables[k]->IsSubBlockActive(i)) {
                unsigned int moffset = loadables[k]->GetSubBlockOffset(i);
                for (unsigned int row = 0; row < loadables[k]->GetSubBlockSize(i); ++row) {
                    R(row + moffset) += grouped_cMv(rowQ) * c;
                    ++rowQ;
                }
            }
        }
    }
}